

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.h
# Opt level: O2

SoundAnalysisPreprocessing_Vggish * __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::mutable_vggish
          (SoundAnalysisPreprocessing *this)

{
  SoundAnalysisPreprocessing_Vggish *this_00;
  
  if (this->_oneof_case_[0] == 0x14) {
    this_00 = (this->SoundAnalysisPreprocessingType_).vggish_;
  }
  else {
    clear_SoundAnalysisPreprocessingType(this);
    this->_oneof_case_[0] = 0x14;
    this_00 = (SoundAnalysisPreprocessing_Vggish *)operator_new(0x18);
    SoundAnalysisPreprocessing_Vggish::SoundAnalysisPreprocessing_Vggish(this_00);
    (this->SoundAnalysisPreprocessingType_).vggish_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish* SoundAnalysisPreprocessing::mutable_vggish() {
  if (!has_vggish()) {
    clear_SoundAnalysisPreprocessingType();
    set_has_vggish();
    SoundAnalysisPreprocessingType_.vggish_ = new ::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.vggish)
  return SoundAnalysisPreprocessingType_.vggish_;
}